

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O0

void __thiscall
TPZChunkVector<TPZCompEl_*,_10>::TPZChunkVector
          (TPZChunkVector<TPZCompEl_*,_10> *this,void **vtt,TPZChunkVector<TPZCompEl_*,_10> *TCh)

{
  TPZCompEl **ppTVar1;
  TPZCompEl ***pppTVar2;
  int64_t iVar3;
  TPZCompEl **ppTVar4;
  TPZChunkVector<TPZCompEl_*,_10> *in_RDX;
  undefined8 *in_RSI;
  TPZManVector<TPZCompEl_**,_10> *in_RDI;
  TPZCompEl **ptrcp;
  TPZCompEl **ptr;
  int64_t k;
  int64_t j;
  int64_t i;
  int64_t nchunks;
  long local_40;
  int64_t local_38;
  
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,(void **)(in_RSI + 1));
  (in_RDI->super_TPZVec<TPZCompEl_**>)._vptr_TPZVec = (_func_int **)*in_RSI;
  TPZVec<TPZCompEl_**>::NElements(&(in_RDX->fVec).super_TPZVec<TPZCompEl_**>);
  TPZManVector<TPZCompEl_**,_10>::TPZManVector(in_RDI,(int64_t)in_RSI);
  pppTVar2 = (TPZCompEl ***)NElements(in_RDX);
  (in_RDI->super_TPZVec<TPZCompEl_**>).fStore = pppTVar2;
  iVar3 = TPZVec<TPZCompEl_**>::NElements(&(in_RDX->fVec).super_TPZVec<TPZCompEl_**>);
  for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
    pppTVar2 = TPZVec<TPZCompEl_**>::operator[](&(in_RDX->fVec).super_TPZVec<TPZCompEl_**>,local_38)
    ;
    if (*pppTVar2 == (TPZCompEl **)0x0) {
      pppTVar2 = TPZVec<TPZCompEl_**>::operator[]
                           ((TPZVec<TPZCompEl_**> *)&(in_RDI->super_TPZVec<TPZCompEl_**>).fNElements
                            ,local_38);
      *pppTVar2 = (TPZCompEl **)0x0;
    }
    else {
      ppTVar4 = (TPZCompEl **)operator_new__(0x2000);
      pppTVar2 = TPZVec<TPZCompEl_**>::operator[]
                           ((TPZVec<TPZCompEl_**> *)&(in_RDI->super_TPZVec<TPZCompEl_**>).fNElements
                            ,local_38);
      *pppTVar2 = ppTVar4;
      pppTVar2 = TPZVec<TPZCompEl_**>::operator[]
                           (&(in_RDX->fVec).super_TPZVec<TPZCompEl_**>,local_38);
      ppTVar1 = *pppTVar2;
      for (local_40 = 0; local_40 < 0x400; local_40 = local_40 + 1) {
        ppTVar4[local_40] = ppTVar1[local_40];
      }
    }
  }
  return;
}

Assistant:

TPZChunkVector<T, EXP>::TPZChunkVector(const TPZChunkVector<T, EXP> &TCh) :
fVec(TCh.fVec.NElements()) {

    fNElements = TCh.NElements();
    int64_t nchunks = TCh.fVec.NElements();

    for (int64_t i = 0; i < nchunks; i++) {
        if (!TCh.fVec[i]) {
            fVec[i] = NULL;
        } else {
            int64_t j, k = 1 << EXP;
            T* ptr = new T[1 << EXP];
            fVec[i] = ptr;
            T* ptrcp = TCh.fVec[i];
            for (j = 0; j < k; j++) {
                ptr[j] = ptrcp[j];
            }
        }
    }
}